

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O0

SimpleString __thiscall
MockExpectedCallsList::fulfilledCallsToString(MockExpectedCallsList *this,SimpleString *linePrefix)

{
  size_t stringToAppend;
  byte bVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  SimpleString SVar2;
  SimpleString local_68;
  SimpleString local_58 [2];
  undefined8 *local_38;
  MockExpectedCallsListNode *p;
  SimpleString str;
  SimpleString *linePrefix_local;
  MockExpectedCallsList *this_local;
  
  str.bufferSize_ = in_RDX;
  SimpleString::SimpleString((SimpleString *)&p,"");
  for (local_38 = (undefined8 *)linePrefix->bufferSize_; local_38 != (undefined8 *)0x0;
      local_38 = (undefined8 *)local_38[1]) {
    bVar1 = (**(code **)(*(long *)*local_38 + 0x180))();
    stringToAppend = str.bufferSize_;
    if ((bVar1 & 1) != 0) {
      (**(code **)(*(long *)*local_38 + 0x1e0))(&local_68);
      appendStringOnANewLine(local_58,(SimpleString *)&p,(SimpleString *)stringToAppend);
      SimpleString::operator=((SimpleString *)&p,local_58);
      SimpleString::~SimpleString(local_58);
      SimpleString::~SimpleString(&local_68);
    }
  }
  stringOrNoneTextWhenEmpty((SimpleString *)this,(SimpleString *)&p);
  SimpleString::~SimpleString((SimpleString *)&p);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString MockExpectedCallsList::fulfilledCallsToString(const SimpleString& linePrefix) const
{
    SimpleString str;

    for (MockExpectedCallsListNode* p = head_; p; p = p->next_)
        if (p->expectedCall_->isFulfilled())
            str = appendStringOnANewLine(str, linePrefix, p->expectedCall_->callToString());

    return stringOrNoneTextWhenEmpty(str, linePrefix);
}